

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agency.c
# Opt level: O0

int equal_agency(agency_t *a,agency_t *b)

{
  int iVar1;
  byte local_19;
  agency_t *b_local;
  agency_t *a_local;
  
  iVar1 = strcmp(a->id,b->id);
  local_19 = 0;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->name,b->name);
    local_19 = 0;
    if (iVar1 == 0) {
      iVar1 = strcmp(a->url,b->url);
      local_19 = 0;
      if (iVar1 == 0) {
        iVar1 = strcmp(a->timezone,b->timezone);
        local_19 = 0;
        if (iVar1 == 0) {
          iVar1 = strcmp(a->lang,b->lang);
          local_19 = 0;
          if (iVar1 == 0) {
            iVar1 = strcmp(a->phone,b->phone);
            local_19 = 0;
            if (iVar1 == 0) {
              iVar1 = strcmp(a->fare_url,b->fare_url);
              local_19 = 0;
              if (iVar1 == 0) {
                iVar1 = strcmp(a->email,b->email);
                local_19 = iVar1 != 0 ^ 0xff;
              }
            }
          }
        }
      }
    }
  }
  return (int)(local_19 & 1);
}

Assistant:

int equal_agency(const agency_t *a, const agency_t *b) {
    return (!strcmp(a->id, b->id) &&
             !strcmp(a->name, b->name) &&
             !strcmp(a->url, b->url) &&
             !strcmp(a->timezone, b->timezone) &&
             !strcmp(a->lang, b->lang) &&
             !strcmp(a->phone, b->phone) &&
             !strcmp(a->fare_url, b->fare_url) &&
             !strcmp(a->email, b->email));
}